

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

EffectiveSign slang::ast::Expression::conjunction(EffectiveSign left,EffectiveSign right)

{
  EffectiveSign right_local;
  EffectiveSign left_local;
  EffectiveSign local_4;
  
  local_4 = right;
  if ((left != Either) && (local_4 = left, right != Either)) {
    if ((left == Signed) && (right == Signed)) {
      local_4 = Signed;
    }
    else {
      local_4 = Unsigned;
    }
  }
  return local_4;
}

Assistant:

Expression::EffectiveSign Expression::conjunction(EffectiveSign left, EffectiveSign right) {
    if (left == EffectiveSign::Either)
        return right;
    if (right == EffectiveSign::Either)
        return left;
    if (left == EffectiveSign::Signed && right == EffectiveSign::Signed)
        return EffectiveSign::Signed;
    return EffectiveSign::Unsigned;
}